

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O3

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color_mode
          (ansicolor_sink<spdlog::details::console_mutex> *this,color_mode mode)

{
  bool bVar1;
  
  if (mode == always) {
    bVar1 = true;
  }
  else {
    if (mode != never) {
      if (mode != automatic) {
        return;
      }
      bVar1 = details::os::in_terminal(this->target_file_);
      if (bVar1) {
        bVar1 = details::os::is_color_terminal();
        goto LAB_0018697d;
      }
    }
    bVar1 = false;
  }
LAB_0018697d:
  this->should_do_colors_ = bVar1;
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color_mode(color_mode mode)
{
    switch (mode)
    {
    case color_mode::always:
        should_do_colors_ = true;
        return;
    case color_mode::automatic:
        should_do_colors_ = details::os::in_terminal(target_file_) && details::os::is_color_terminal();
        return;
    case color_mode::never:
        should_do_colors_ = false;
        return;
    }
}